

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_range_join.cpp
# Opt level: O2

BufferHandle *
duckdb::PhysicalRangeJoin::SliceSortedPayload
          (BufferHandle *__return_storage_ptr__,DataChunk *payload,GlobalSortState *state,
          idx_t block_idx,SelectionVector *result,idx_t result_count,idx_t left_cols)

{
  idx_t iVar1;
  reference pvVar2;
  type sd;
  data_ptr_t pdVar3;
  SelectionVector *row_sel;
  reference col;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  idx_t col_no;
  ulong uVar7;
  SelectionVector gsel;
  LogicalType local_158;
  SBScanState read_state;
  Vector addresses;
  
  SBScanState::SBScanState(&read_state,state->buffer_manager,state);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
           ::get<true>(&state->sorted_blocks,0);
  read_state.sb =
       (pvVar2->super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>).
       _M_t.super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
       .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
  sd = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator*
                 (&(read_state.sb)->payload_data);
  SBScanState::SetIndices(&read_state,block_idx,0);
  SBScanState::PinData(&read_state,sd);
  pdVar3 = SBScanState::DataPtr(&read_state,sd);
  LogicalType::LogicalType(&local_158,POINTER);
  Vector::Vector(&addresses,&local_158,result_count);
  LogicalType::~LogicalType(&local_158);
  if (result->sel_vector == (uint *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = (ulong)*result->sel_vector;
  }
  iVar1 = (sd->layout).row_width;
  SelectionVector::SelectionVector(&gsel,result_count);
  *gsel.sel_vector = 0;
  *(data_ptr_t *)addresses.data = pdVar3 + uVar7 * iVar1;
  lVar6 = 0;
  for (uVar4 = 1; uVar4 < result_count; uVar4 = uVar4 + 1) {
    uVar5 = uVar4;
    if (result->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)result->sel_vector[uVar4];
    }
    if (uVar5 != uVar7) {
      *(data_ptr_t *)(addresses.data + lVar6 * 8 + 8) = pdVar3 + uVar5 * iVar1;
      lVar6 = lVar6 + 1;
      uVar7 = uVar5;
    }
    gsel.sel_vector[uVar4] = (sel_t)lVar6;
  }
  if (((sd->layout).all_constant == false) && (state->external == true)) {
    pdVar3 = BufferHandle::Ptr(&read_state.payload_heap_handle);
  }
  else {
    pdVar3 = (data_ptr_t)0x0;
  }
  row_sel = FlatVector::IncrementalSelectionVector();
  for (uVar7 = 0;
      uVar7 < (ulong)(((long)(sd->layout).types.
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             .
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(sd->layout).types.
                            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar7 = uVar7 + 1) {
    col = vector<duckdb::Vector,_true>::get<true>(&payload->data,left_cols + uVar7);
    RowOperations::Gather(&addresses,row_sel,col,row_sel,lVar6 + 1,&sd->layout,uVar7,0,pdVar3);
    Vector::Slice(col,&gsel,result_count);
  }
  BufferHandle::BufferHandle(__return_storage_ptr__,&read_state.payload_heap_handle);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&gsel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Vector::~Vector(&addresses);
  SBScanState::~SBScanState(&read_state);
  return __return_storage_ptr__;
}

Assistant:

BufferHandle PhysicalRangeJoin::SliceSortedPayload(DataChunk &payload, GlobalSortState &state, const idx_t block_idx,
                                                   const SelectionVector &result, const idx_t result_count,
                                                   const idx_t left_cols) {
	// There should only be one sorted block if they have been sorted
	D_ASSERT(state.sorted_blocks.size() == 1);
	SBScanState read_state(state.buffer_manager, state);
	read_state.sb = state.sorted_blocks[0].get();
	auto &sorted_data = *read_state.sb->payload_data;

	read_state.SetIndices(block_idx, 0);
	read_state.PinData(sorted_data);
	const auto data_ptr = read_state.DataPtr(sorted_data);
	data_ptr_t heap_ptr = nullptr;

	// Set up a batch of pointers to scan data from
	Vector addresses(LogicalType::POINTER, result_count);
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);

	// Set up the data pointers for the values that are actually referenced
	const idx_t &row_width = sorted_data.layout.GetRowWidth();

	auto prev_idx = result.get_index(0);
	SelectionVector gsel(result_count);
	idx_t addr_count = 0;
	gsel.set_index(0, addr_count);
	data_pointers[addr_count] = data_ptr + prev_idx * row_width;
	for (idx_t i = 1; i < result_count; ++i) {
		const auto row_idx = result.get_index(i);
		if (row_idx != prev_idx) {
			data_pointers[++addr_count] = data_ptr + row_idx * row_width;
			prev_idx = row_idx;
		}
		gsel.set_index(i, addr_count);
	}
	++addr_count;

	// Unswizzle the offsets back to pointers (if needed)
	if (!sorted_data.layout.AllConstant() && state.external) {
		heap_ptr = read_state.payload_heap_handle.Ptr();
	}

	// Deserialize the payload data
	auto sel = FlatVector::IncrementalSelectionVector();
	for (idx_t col_no = 0; col_no < sorted_data.layout.ColumnCount(); col_no++) {
		auto &col = payload.data[left_cols + col_no];
		RowOperations::Gather(addresses, *sel, col, *sel, addr_count, sorted_data.layout, col_no, 0, heap_ptr);
		col.Slice(gsel, result_count);
	}

	return std::move(read_state.payload_heap_handle);
}